

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::replicate(SVInt *this,SVInt *times)

{
  optional<unsigned_int> oVar1;
  SVInt *in_RDX;
  undefined8 extraout_RDX;
  ulong uVar2;
  SVInt SVar3;
  span<const_slang::SVInt,_18446744073709551615UL> operands;
  SmallVector<slang::SVInt,_2UL> buffer;
  SmallVector<slang::SVInt,_2UL> local_58;
  
  oVar1 = as<unsigned_int>(in_RDX);
  if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
    SmallVector<slang::SVInt,_2UL>::SmallVector
              (&local_58,
               (ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0xffffffff);
    for (uVar2 = (ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> & 0xffffffff; uVar2 != 0;
        uVar2 = uVar2 - 1) {
      SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt_const&>
                (&local_58.super_SmallVectorBase<slang::SVInt>,times);
    }
    operands._M_extent._M_extent_value = (size_t)local_58.super_SmallVectorBase<slang::SVInt>.data_;
    operands._M_ptr = this;
    concat(operands);
    SmallVectorBase<slang::SVInt>::cleanup
              (&local_58.super_SmallVectorBase<slang::SVInt>,
               (EVP_PKEY_CTX *)local_58.super_SmallVectorBase<slang::SVInt>.data_);
    SVar3.super_SVIntStorage.bitWidth = (int)extraout_RDX;
    SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
    SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
    SVar3.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
    SVar3.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
    return (SVInt)SVar3.super_SVIntStorage;
  }
  std::__throw_bad_optional_access();
}

Assistant:

SVInt SVInt::replicate(const SVInt& times) const {
    uint32_t n = times.as<uint32_t>().value();
    SmallVector<SVInt> buffer(n, UninitializedTag());
    for (size_t i = 0; i < n; ++i)
        buffer.push_back(*this);
    return concat(std::span<SVInt const>(buffer.begin(), buffer.end()));
}